

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O3

void watchDogThreadFunc(void *arg)

{
  int iVar1;
  deUint64 dVar2;
  
  iVar1 = *(int *)((long)arg + 0x30);
  while( true ) {
    if (iVar1 != 0) {
      return;
    }
    dVar2 = deGetMicroseconds();
    if ((*(int *)((long)arg + 0x14) < (int)((dVar2 - *(long *)((long)arg + 0x20)) / 1000000)) ||
       (*(int *)((long)arg + 0x10) < (int)((dVar2 - *(long *)((long)arg + 0x18)) / 1000000))) break;
    deSleep(100);
    iVar1 = *(int *)((long)arg + 0x30);
  }
  (**arg)(arg,*(undefined8 *)((long)arg + 8));
  return;
}

Assistant:

static void watchDogThreadFunc (void* arg)
{
	qpWatchDog* dog = (qpWatchDog*)arg;
	DE_ASSERT(dog);

	DBGPRINT(("watchDogThreadFunc(): start\n"));

	while (dog->status == STATUS_THREAD_RUNNING)
	{
		deUint64	curTime					= deGetMicroseconds();
		int			totalSecondsPassed		= (int)((curTime - dog->resetTime) / 1000000ull);
		int			secondsSinceLastTouch	= (int)((curTime - dog->lastTouchTime) / 1000000ull);

		if ((secondsSinceLastTouch > dog->intervalTimeLimit) || (totalSecondsPassed > dog->totalTimeLimit))
		{
			DBGPRINT(("watchDogThreadFunc(): call timeout func\n"));
			dog->timeOutFunc(dog, dog->timeOutUserPtr);
			break;
		}

		deSleep(100);
	}

	DBGPRINT(("watchDogThreadFunc(): stop\n"));
}